

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O3

KUINT16 __thiscall
KDIS::KDataStream::CopyIntoBuffer
          (KDataStream *this,KOCTET *Buffer,KUINT16 BufferSize,KUINT16 WritePos)

{
  short sVar1;
  pointer puVar2;
  KException *this_00;
  undefined6 in_register_0000000a;
  ulong uVar3;
  undefined6 in_register_00000012;
  pointer puVar4;
  
  uVar3 = CONCAT62(in_register_0000000a,WritePos);
  puVar2 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar1 = (short)puVar4;
  if ((int)CONCAT62(in_register_00000012,BufferSize) - (int)uVar3 <
      (int)((int)puVar4 - (int)puVar2 & 0xffffU)) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    KException::KException(this_00,1);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  if (puVar2 != puVar4) {
    do {
      Buffer[uVar3 & 0xffff] = *puVar2;
      puVar2 = puVar2 + 1;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (puVar2 != puVar4);
    puVar4 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar1 = (short)(this->m_vBuffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  }
  return sVar1 - (short)puVar4;
}

Assistant:

KUINT16 KDataStream::CopyIntoBuffer(KOCTET *Buffer, KUINT16 BufferSize, KUINT16 WritePos /*= 0*/ ) const noexcept(false)
{
    if( ( BufferSize - WritePos ) < ( KUINT16 )m_vBuffer.size() )
    {
        throw KException( BUFFER_TOO_SMALL );
    }

    auto citr = m_vBuffer.begin();
    auto citrEnd = m_vBuffer.end();

    KUINT16 CurrentWritePos = WritePos;

    for( ; citr != citrEnd; ++citr, ++CurrentWritePos )
    {
        Buffer[CurrentWritePos] = *citr;
    }

    return static_cast<KUINT16>(m_vBuffer.size());
}